

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

uint16_t * getMissingLeavesList(uint16_t *challengeC,picnic_instance_t *params)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint16_t *puVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  
  uVar2 = params->num_rounds;
  bVar1 = params->num_opened_rounds;
  puVar4 = (uint16_t *)calloc((ulong)uVar2 - (ulong)bVar1,2);
  lVar6 = 0;
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    iVar3 = contains(challengeC,(ulong)bVar1,(uint16_t)uVar5);
    if (iVar3 == 0) {
      puVar4[lVar6] = (uint16_t)uVar5;
      lVar6 = lVar6 + 1;
    }
  }
  return puVar4;
}

Assistant:

static uint16_t* getMissingLeavesList(uint16_t* challengeC, const picnic_instance_t* params) {
  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = calloc(missingLeavesSize, sizeof(uint16_t));
  size_t pos               = 0;

  for (size_t i = 0; i < params->num_rounds; i++) {
    if (!contains(challengeC, params->num_opened_rounds, i)) {
      missingLeaves[pos] = i;
      pos++;
    }
  }

  return missingLeaves;
}